

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O3

char * getSelectionString(Atom selection)

{
  long lVar1;
  uint uVar2;
  Atom AVar3;
  int iVar4;
  Window WVar5;
  unsigned_long *puVar6;
  char *pcVar7;
  char *pcVar8;
  uint uVar9;
  long lVar10;
  size_t __size;
  bool bVar11;
  undefined1 local_218 [8];
  XEvent dummy;
  XEvent notification;
  undefined1 local_90 [8];
  unsigned_long bytesAfter;
  Atom local_78;
  Atom actualType;
  unsigned_long itemCount;
  Atom local_60;
  long local_58;
  undefined1 local_4c [4];
  char *pcStack_48;
  int actualFormat;
  uint local_3c;
  char *local_38;
  char *data;
  
  bytesAfter = _glfw.x11.UTF8_STRING;
  notification.pad[0x17] = 0x1f;
  bVar11 = _glfw.x11.PRIMARY != selection;
  WVar5 = XGetSelectionOwner(_glfw.x11.display,selection);
  pcVar7 = *(char **)((long)_glfw.x11.keynames + (ulong)bVar11 * 8 + -0x10);
  if (WVar5 != _glfw.x11.helperWindowHandle) {
    lVar1 = (ulong)bVar11 * 8;
    lVar10 = lVar1 + 0x1ff08;
    free(pcVar7);
    *(undefined8 *)((long)_glfw.x11.keynames + lVar1 + -0x10) = 0;
    puVar6 = &bytesAfter;
    uVar9 = 1;
    local_60 = selection;
    local_58 = lVar10;
    do {
      itemCount = *puVar6;
      XConvertSelection(_glfw.x11.display,selection,itemCount,_glfw.x11.GLFW_SELECTION,
                        _glfw.x11.helperWindowHandle,0);
      while (iVar4 = XCheckTypedWindowEvent
                               (_glfw.x11.display,_glfw.x11.helperWindowHandle,0x1f,dummy.pad + 0x17
                               ), iVar4 == 0) {
        waitForEvent((double *)0x0);
      }
      if (notification.xkey.subwindow != 0) {
        XCheckIfEvent(_glfw.x11.display,local_218,isSelPropNewValueNotify,dummy.pad + 0x17);
        XGetWindowProperty(_glfw.x11.display,notification.xany.display,notification.xkey.subwindow,0
                           ,0x7fffffffffffffff,1,0,&local_78,local_4c,&actualType,local_90,&local_38
                          );
        if (local_78 == _glfw.x11.INCR) {
          __size = 1;
          pcStack_48 = (char *)0x0;
          local_3c = uVar9;
          while( true ) {
            while (iVar4 = XCheckIfEvent(_glfw.x11.display,local_218,isSelPropNewValueNotify,
                                         dummy.pad + 0x17), iVar4 == 0) {
              waitForEvent((double *)0x0);
            }
            XFree(local_38);
            XGetWindowProperty(_glfw.x11.display,notification.xany.display,
                               notification.xkey.subwindow,0,0x7fffffffffffffff,1,0,&local_78,
                               local_4c,&actualType,local_90,&local_38);
            pcVar7 = pcStack_48;
            AVar3 = actualType;
            if (actualType == 0) break;
            __size = __size + actualType;
            pcStack_48 = (char *)realloc(pcStack_48,__size);
            pcStack_48[~AVar3 + __size] = '\0';
            strcat(pcStack_48,local_38);
          }
          if (itemCount == 0x1f) {
            pcVar8 = convertLatin1toUTF8(pcStack_48);
            lVar10 = local_58;
            *(char **)((long)&_glfw.initialized + local_58) = pcVar8;
            free(pcVar7);
            selection = local_60;
            uVar9 = local_3c;
          }
          else {
            *(char **)((long)&_glfw.initialized + local_58) = pcStack_48;
            lVar10 = local_58;
            selection = local_60;
            uVar9 = local_3c;
          }
        }
        else if (local_78 == itemCount) {
          if (itemCount == 0x1f) {
            pcVar7 = convertLatin1toUTF8(local_38);
          }
          else {
            pcVar7 = _glfw_strdup(local_38);
          }
          *(char **)((long)&_glfw.initialized + lVar10) = pcVar7;
        }
        XFree(local_38);
        pcVar7 = *(char **)((long)&_glfw.initialized + lVar10);
        if (pcVar7 != (char *)0x0) {
          return pcVar7;
        }
      }
      puVar6 = (unsigned_long *)(notification.pad + 0x17);
      uVar2 = uVar9 & 1;
      uVar9 = 0;
    } while (uVar2 != 0);
    pcVar7 = *(char **)((long)&_glfw.initialized + lVar10);
    if (pcVar7 == (char *)0x0) {
      _glfwInputError(0x10009,"X11: Failed to convert selection to string");
      pcVar7 = *(char **)((long)&_glfw.initialized + lVar10);
    }
  }
  return pcVar7;
}

Assistant:

static const char* getSelectionString(Atom selection)
{
    char** selectionString = NULL;
    const Atom targets[] = { _glfw.x11.UTF8_STRING, XA_STRING };
    const size_t targetCount = sizeof(targets) / sizeof(targets[0]);

    if (selection == _glfw.x11.PRIMARY)
        selectionString = &_glfw.x11.primarySelectionString;
    else
        selectionString = &_glfw.x11.clipboardString;

    if (XGetSelectionOwner(_glfw.x11.display, selection) ==
        _glfw.x11.helperWindowHandle)
    {
        // Instead of doing a large number of X round-trips just to put this
        // string into a window property and then read it back, just return it
        return *selectionString;
    }

    free(*selectionString);
    *selectionString = NULL;

    for (size_t i = 0;  i < targetCount;  i++)
    {
        char* data;
        Atom actualType;
        int actualFormat;
        unsigned long itemCount, bytesAfter;
        XEvent notification, dummy;

        XConvertSelection(_glfw.x11.display,
                          selection,
                          targets[i],
                          _glfw.x11.GLFW_SELECTION,
                          _glfw.x11.helperWindowHandle,
                          CurrentTime);

        while (!XCheckTypedWindowEvent(_glfw.x11.display,
                                       _glfw.x11.helperWindowHandle,
                                       SelectionNotify,
                                       &notification))
        {
            waitForEvent(NULL);
        }

        if (notification.xselection.property == None)
            continue;

        XCheckIfEvent(_glfw.x11.display,
                      &dummy,
                      isSelPropNewValueNotify,
                      (XPointer) &notification);

        XGetWindowProperty(_glfw.x11.display,
                           notification.xselection.requestor,
                           notification.xselection.property,
                           0,
                           LONG_MAX,
                           True,
                           AnyPropertyType,
                           &actualType,
                           &actualFormat,
                           &itemCount,
                           &bytesAfter,
                           (unsigned char**) &data);

        if (actualType == _glfw.x11.INCR)
        {
            size_t size = 1;
            char* string = NULL;

            for (;;)
            {
                while (!XCheckIfEvent(_glfw.x11.display,
                                      &dummy,
                                      isSelPropNewValueNotify,
                                      (XPointer) &notification))
                {
                    waitForEvent(NULL);
                }

                XFree(data);
                XGetWindowProperty(_glfw.x11.display,
                                   notification.xselection.requestor,
                                   notification.xselection.property,
                                   0,
                                   LONG_MAX,
                                   True,
                                   AnyPropertyType,
                                   &actualType,
                                   &actualFormat,
                                   &itemCount,
                                   &bytesAfter,
                                   (unsigned char**) &data);

                if (itemCount)
                {
                    size += itemCount;
                    string = realloc(string, size);
                    string[size - itemCount - 1] = '\0';
                    strcat(string, data);
                }

                if (!itemCount)
                {
                    if (targets[i] == XA_STRING)
                    {
                        *selectionString = convertLatin1toUTF8(string);
                        free(string);
                    }
                    else
                        *selectionString = string;

                    break;
                }
            }
        }
        else if (actualType == targets[i])
        {
            if (targets[i] == XA_STRING)
                *selectionString = convertLatin1toUTF8(data);
            else
                *selectionString = _glfw_strdup(data);
        }

        XFree(data);

        if (*selectionString)
            break;
    }

    if (!*selectionString)
    {
        _glfwInputError(GLFW_FORMAT_UNAVAILABLE,
                        "X11: Failed to convert selection to string");
    }

    return *selectionString;
}